

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

void __thiscall jsonrpccxx::JsonRpcException::~JsonRpcException(JsonRpcException *this)

{
  ~JsonRpcException(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

JsonRpcException(int code, const std::string &message, const json &data) noexcept
        : code(code), message(message), data(data), err(std::to_string(code) + ": " + message + ", data: " + data.dump()) {}